

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  int iVar3;
  uint32 uVar4;
  uint *puVar5;
  unsigned_long *puVar6;
  int *piVar7;
  long *plVar8;
  LogMessage *other;
  size_t sVar9;
  size_t sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  MessageLite *pMVar12;
  size_t size;
  int local_b8;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  size_t tag_size;
  LogMessage local_78;
  int local_3c;
  int local_38;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  size_t result;
  Extension *pEStack_10;
  int number_local;
  Extension *this_local;
  
  _i_1 = 0;
  result._4_4_ = number;
  pEStack_10 = this;
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      FVar1 = anon_unknown_29::real_type(this->type);
      sVar9 = WireFormatLite::TagSize(number,FVar1);
      _i_1 = _i_1 + sVar9;
      FVar1 = anon_unknown_29::real_type(this->type);
      switch(FVar1) {
      case TYPE_DOUBLE:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_FLOAT:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_INT64:
        sVar9 = WireFormatLite::Int64Size((this->field_0).int64_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_UINT64:
        sVar9 = WireFormatLite::UInt64Size((this->field_0).uint64_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_INT32:
        sVar9 = WireFormatLite::Int32Size((this->field_0).int32_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_FIXED64:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_FIXED32:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_BOOL:
        _i_1 = _i_1 + 1;
        break;
      case TYPE_STRING:
        sVar9 = WireFormatLite::StringSize((this->field_0).string_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_GROUP:
        sVar9 = WireFormatLite::GroupSize((this->field_0).message_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          sVar9 = WireFormatLite::MessageSize((this->field_0).message_value);
          _i_1 = sVar9 + _i_1;
        }
        else {
          uVar4 = (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase)
                               .arena_ + 0x50))();
          sVar9 = io::CodedOutputStream::VarintSize32(uVar4);
          _i_1 = sVar9 + (long)(int)uVar4 + _i_1;
        }
        break;
      case TYPE_BYTES:
        sVar9 = WireFormatLite::BytesSize((this->field_0).string_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_UINT32:
        sVar9 = WireFormatLite::UInt32Size((this->field_0).uint32_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_ENUM:
        sVar9 = WireFormatLite::EnumSize((this->field_0).enum_value);
        _i_1 = sVar9 + _i_1;
        break;
      case TYPE_SFIXED32:
        _i_1 = _i_1 + 4;
        break;
      case TYPE_SFIXED64:
        _i_1 = _i_1 + 8;
        break;
      case TYPE_SINT32:
        sVar9 = WireFormatLite::SInt32Size((this->field_0).int32_value);
        _i_1 = sVar9 + _i_1;
        break;
      case MAX_FIELD_TYPE:
        sVar9 = WireFormatLite::SInt64Size((this->field_0).int64_value);
        _i_1 = sVar9 + _i_1;
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar1 = anon_unknown_29::real_type(this->type);
    sVar9 = WireFormatLite::TagSize(number,FVar1);
    FVar1 = anon_unknown_29::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_FLOAT:
      iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_INT64:
      iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_10 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          i_10 < iVar3; i_10 = i_10 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_10);
        sVar9 = WireFormatLite::Int64Size(*plVar8);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT64:
      iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_12 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          i_12 < iVar3; i_12 = i_12 + 1) {
        puVar6 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_12);
        sVar9 = WireFormatLite::UInt64Size(*puVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_INT32:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_9 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_9 < iVar3; i_9 = i_9 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_9);
        sVar9 = WireFormatLite::Int32Size(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_FIXED32:
      iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_BOOL:
      iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 1) * sVar10 + _i_1;
      break;
    case TYPE_STRING:
      iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((this->field_0).repeated_string_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_15 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), i_15 < iVar3; i_15 = i_15 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_15);
        sVar9 = WireFormatLite::StringSize(pbVar11);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_GROUP:
      iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((this->field_0).repeated_message_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (local_b8 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), local_b8 < iVar3;
          local_b8 = local_b8 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_b8);
        sVar9 = WireFormatLite::GroupSize(pMVar12);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_MESSAGE:
      iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((this->field_0).repeated_message_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (size._4_4_ = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), size._4_4_ < iVar3;
          size._4_4_ = size._4_4_ + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,size._4_4_);
        sVar9 = WireFormatLite::MessageSize(pMVar12);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_BYTES:
      iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((this->field_0).repeated_string_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_16 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), i_16 < iVar3; i_16 = i_16 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_16);
        sVar9 = WireFormatLite::BytesSize(pbVar11);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT32:
      iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_11 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          i_11 < iVar3; i_11 = i_11 + 1) {
        puVar5 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_11);
        sVar9 = WireFormatLite::UInt32Size(*puVar5);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_ENUM:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_17 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_17 < iVar3; i_17 = i_17 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_17);
        sVar9 = WireFormatLite::EnumSize(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 4) * sVar10 + _i_1;
      break;
    case TYPE_SFIXED64:
      iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = (sVar9 + 8) * sVar10 + _i_1;
      break;
    case TYPE_SINT32:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_13 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          i_13 < iVar3; i_13 = i_13 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_13);
        sVar9 = WireFormatLite::SInt32Size(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      sVar10 = FromIntSize(iVar3);
      _i_1 = sVar9 * sVar10 + _i_1;
      for (i_14 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          i_14 < iVar3; i_14 = i_14 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_14);
        sVar9 = WireFormatLite::SInt64Size(*plVar8);
        _i_1 = sVar9 + _i_1;
      }
    }
  }
  else {
    FVar1 = anon_unknown_29::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_FLOAT:
      iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar3 = i_3,
          iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar3 < iVar2;
          i_3 = i_3 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_3);
        sVar9 = WireFormatLite::Int64Size(*plVar8);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar3 = i_5,
          iVar2 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar3 < iVar2; i_5 = i_5 + 1) {
        puVar6 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_5);
        sVar9 = WireFormatLite::UInt64Size(*puVar6);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar3 = i_2,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          i_2 = i_2 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_2);
        sVar9 = WireFormatLite::Int32Size(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_FIXED64:
      iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_FIXED32:
      iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_BOOL:
      iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 + _i_1;
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x62d);
      other = LogMessage::operator<<(&local_78,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&tag_size + 3),other);
      LogMessage::~LogMessage(&local_78);
      break;
    case TYPE_UINT32:
      for (i_4 = 0; iVar3 = i_4,
          iVar2 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar3 < iVar2; i_4 = i_4 + 1) {
        puVar5 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_4);
        sVar9 = WireFormatLite::UInt32Size(*puVar5);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_ENUM:
      for (local_3c = 0; iVar3 = local_3c,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          local_3c = local_3c + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,local_3c);
        sVar9 = WireFormatLite::EnumSize(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case TYPE_SFIXED32:
      iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 4 + _i_1;
      break;
    case TYPE_SFIXED64:
      iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value);
      sVar9 = FromIntSize(iVar3);
      _i_1 = sVar9 * 8 + _i_1;
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar3 = i_6,
          iVar2 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar3 < iVar2;
          i_6 = i_6 + 1) {
        piVar7 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_6);
        sVar9 = WireFormatLite::SInt32Size(*piVar7);
        _i_1 = sVar9 + _i_1;
      }
      break;
    case MAX_FIELD_TYPE:
      for (local_38 = 0; iVar3 = local_38,
          iVar2 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar3 < iVar2;
          local_38 = local_38 + 1) {
        plVar8 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,local_38);
        sVar9 = WireFormatLite::SInt64Size(*plVar8);
        _i_1 = sVar9 + _i_1;
      }
    }
    iVar3 = ToCachedSize(_i_1);
    this->cached_size = iVar3;
    if (_i_1 != 0) {
      sVar9 = io::CodedOutputStream::VarintSize32((uint32)_i_1);
      _i_1 = sVar9 + _i_1;
      uVar4 = WireFormatLite::MakeTag(result._4_4_,WIRETYPE_LENGTH_DELIMITED);
      sVar9 = io::CodedOutputStream::VarintSize32(uVar4);
      _i_1 = sVar9 + _i_1;
    }
  }
  return _i_1;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += WireFormatLite::k##CAMELCASE##Size *                    \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(
            WireFormatLite::MakeTag(number,
                WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += tag_size *                                              \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            result += WireFormatLite::CAMELCASE##Size(                      \
              repeated_##LOWERCASE##_value->Get(i));                        \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *       \
                    FromIntSize(repeated_##LOWERCASE##_value->size());      \
          break
        HANDLE_TYPE( FIXED32,  Fixed32, uint32);
        HANDLE_TYPE( FIXED64,  Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,  int32);
        HANDLE_TYPE(SFIXED64, SFixed64,  int64);
        HANDLE_TYPE(   FLOAT,    Float,  float);
        HANDLE_TYPE(  DOUBLE,   Double, double);
        HANDLE_TYPE(    BOOL,     Bool,   bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                      \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::CAMELCASE##Size(LOWERCASE);             \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)                                 \
      case WireFormatLite::TYPE_##UPPERCASE:                              \
        result += WireFormatLite::k##CAMELCASE##Size;                     \
        break
      HANDLE_TYPE( FIXED32,  Fixed32);
      HANDLE_TYPE( FIXED64,  Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(   FLOAT,    Float);
      HANDLE_TYPE(  DOUBLE,   Double);
      HANDLE_TYPE(    BOOL,     Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}